

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

void __thiscall
cmStateDirectory::AppendProperty
          (cmStateDirectory *this,string *prop,char *value,bool asString,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  PointerType pBVar2;
  allocator local_49;
  string local_48;
  
  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_48,value,&local_49);
    AppendIncludeDirectoriesEntry(this,&local_48,lfbt);
  }
  else {
    bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_48,value,&local_49);
      AppendCompileOptionsEntry(this,&local_48,lfbt);
    }
    else {
      bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
      if (!bVar1) {
        pBVar2 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           (&this->DirectoryState);
        cmPropertyMap::AppendProperty(&pBVar2->Properties,prop,value,asString);
        return;
      }
      std::__cxx11::string::string((string *)&local_48,value,&local_49);
      AppendCompileDefinitionsEntry(this,&local_48,lfbt);
    }
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmStateDirectory::AppendProperty(const std::string& prop,
                                      const char* value, bool asString,
                                      cmListFileBacktrace const& lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES") {
    this->AppendIncludeDirectoriesEntry(value, lfbt);
    return;
  }
  if (prop == "COMPILE_OPTIONS") {
    this->AppendCompileOptionsEntry(value, lfbt);
    return;
  }
  if (prop == "COMPILE_DEFINITIONS") {
    this->AppendCompileDefinitionsEntry(value, lfbt);
    return;
  }

  this->DirectoryState->Properties.AppendProperty(prop, value, asString);
}